

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O0

void Fxch_DivPrint(Fxch_Man_t *pFxchMan,int iDiv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  float fVar4;
  int local_24;
  int Lit;
  int i;
  Vec_Int_t *vDiv;
  int iDiv_local;
  Fxch_Man_t *pFxchMan_local;
  
  p = Hsh_VecReadEntry(pFxchMan->pDivHash,iDiv);
  printf("Div %7d : ",(ulong)(uint)iDiv);
  fVar4 = Vec_FltEntry(pFxchMan->vDivWeights,iDiv);
  printf("Weight %12.5f  ",(double)fVar4);
  for (local_24 = 0; iVar1 = Vec_IntSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(p,local_24);
    iVar2 = Abc_LitIsCompl(iVar1);
    if (iVar2 == 0) {
      uVar3 = Abc_Lit2Var(iVar1);
      printf("%d(1)",(ulong)uVar3);
    }
  }
  printf(" + ");
  for (local_24 = 0; iVar1 = Vec_IntSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(p,local_24);
    iVar2 = Abc_LitIsCompl(iVar1);
    if (iVar2 != 0) {
      uVar3 = Abc_Lit2Var(iVar1);
      printf("%d(2)",(ulong)uVar3);
    }
  }
  printf(" Lits =%7d  ",(ulong)(uint)pFxchMan->nLits);
  uVar3 = Hsh_VecSize(pFxchMan->pDivHash);
  printf("Divs =%8d  \n",(ulong)uVar3);
  return;
}

Assistant:

void Fxch_DivPrint( Fxch_Man_t* pFxchMan,
                    int iDiv )
{
    Vec_Int_t* vDiv = Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv );
    int i,
        Lit;

    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry( pFxchMan->vDivWeights, iDiv ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( !Abc_LitIsCompl( Lit ) )
            printf( "%d(1)", Abc_Lit2Var( Lit ) );

    printf( " + " );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Lit ) )
            printf( "%d(2)", Abc_Lit2Var( Lit ) );

    printf( " Lits =%7d  ", pFxchMan->nLits );
    printf( "Divs =%8d  \n", Hsh_VecSize( pFxchMan->pDivHash ) );
}